

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFactoryRegistry.cpp
# Opt level: O0

TestFactoryRegistry * CppUnit::TestFactoryRegistryList::getRegistry(string *name)

{
  bool bVar1;
  TestFactoryRegistryList *this;
  string *name_local;
  
  bVar1 = isValid();
  if (!bVar1) {
    __assert_fail("isValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dlaperriere[P]cmake_cppunit/build_O0/cppunit-src/src/cppunit/TestFactoryRegistry.cpp"
                  ,0x47,
                  "static TestFactoryRegistry *CppUnit::TestFactoryRegistryList::getRegistry(const std::string &)"
                 );
  }
  bVar1 = isValid();
  if (bVar1) {
    this = getInstance();
    name_local = (string *)getInternalRegistry(this,name);
  }
  else {
    name_local = (string *)0x0;
  }
  return (TestFactoryRegistry *)name_local;
}

Assistant:

static TestFactoryRegistry *getRegistry( const std::string &name )
  {
    // If the following assertion failed, then TestFactoryRegistry::getRegistry() 
    // was called during static variable destruction without checking the registry 
    // validity beforehand using TestFactoryRegistry::isValid() beforehand.
    assert( isValid() );
    if ( !isValid() )         // release mode
      return NULL;            // => force CRASH

    return getInstance()->getInternalRegistry( name );
  }